

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O2

void close_upvalues(ch_context *context,ch_primitive *last)

{
  ch_primitive *pcVar1;
  anon_union_8_4_dd993ae3_for_ch_primitive_1 aVar2;
  undefined4 uVar3;
  ch_upvalue *pcVar4;
  
  pcVar4 = context->open_upvalues;
  while ((pcVar4 != (ch_upvalue *)0x0 && (pcVar1 = pcVar4->value, last <= pcVar1))) {
    uVar3 = *(undefined4 *)&pcVar1->field_0x4;
    aVar2 = pcVar1->field_1;
    (pcVar4->closed).type = pcVar1->type;
    *(undefined4 *)&(pcVar4->closed).field_0x4 = uVar3;
    (pcVar4->closed).field_1 = aVar2;
    pcVar4->value = &pcVar4->closed;
    pcVar4 = pcVar4->next;
    context->open_upvalues = pcVar4;
  }
  return;
}

Assistant:

static void close_upvalues(ch_context* context, ch_primitive* last) {
  while(context->open_upvalues != NULL && context->open_upvalues->value >= last) {
    ch_upvalue* upvalue = context->open_upvalues;
    upvalue->closed = *upvalue->value;
    upvalue->value = &upvalue->closed;
    context->open_upvalues = upvalue->next;
  }
}